

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalCommonGenerator::cmLocalCommonGenerator
          (cmLocalCommonGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalCommonGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,mf);
  (this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter =
       (_func_int **)&PTR__cmLocalCommonGenerator_0149e9e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigNames);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_38,(this->super_cmLocalGenerator).Makefile,IncludeEmptyConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ConfigNames,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

cmLocalCommonGenerator::cmLocalCommonGenerator(cmGlobalGenerator* gg,
                                               cmMakefile* mf)
  : cmLocalGenerator(gg, mf)
{
  this->ConfigNames =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
}